

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O2

MPP_RET copy2osd2(MppEncOSDData2 *dst,MppEncOSDData *src1,MppEncOSDData2 *src2)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  MPP_RET MVar5;
  long lVar6;
  MppBuffer *ppvVar7;
  
  if (src1 == (MppEncOSDData *)0x0) {
    if (src2 == (MppEncOSDData2 *)0x0) {
      MVar5 = MPP_NOK;
    }
    else {
      memcpy(dst,src2,0x148);
      MVar5 = MPP_OK;
    }
  }
  else {
    uVar2 = src1->num_region;
    dst->num_region = uVar2;
    ppvVar7 = &dst->region[0].buf;
    MVar5 = MPP_OK;
    for (lVar6 = 0; (ulong)uVar2 * 0x1c - lVar6 != 0; lVar6 = lVar6 + 0x1c) {
      puVar1 = (undefined8 *)((long)&src1->region[0].enable + lVar6);
      uVar3 = *puVar1;
      uVar4 = puVar1[1];
      ((MppEncOSDRegion2 *)(ppvVar7 + -4))->enable = (int)uVar3;
      ((MppEncOSDRegion2 *)(ppvVar7 + -4))->inverse = (int)((ulong)uVar3 >> 0x20);
      ppvVar7[-3] = (MppBuffer)uVar4;
      ppvVar7[-2] = (MppBuffer)*(undefined8 *)((long)&src1->region[0].num_mb_x + lVar6);
      *(RK_U32 *)(ppvVar7 + -1) = *(RK_U32 *)((long)&src1->region[0].buf_offset + lVar6);
      *ppvVar7 = src1->buf;
      ppvVar7 = ppvVar7 + 5;
    }
  }
  return MVar5;
}

Assistant:

static MPP_RET copy2osd2(MppEncOSDData2* dst, MppEncOSDData *src1, MppEncOSDData2 *src2)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i = 0;

    if (src1) {
        dst->num_region = src1->num_region;
        for (i = 0; i < src1->num_region; i++) {
            dst->region[i].enable       = src1->region[i].enable;
            dst->region[i].inverse      = src1->region[i].inverse;
            dst->region[i].start_mb_x   = src1->region[i].start_mb_x;
            dst->region[i].start_mb_y   = src1->region[i].start_mb_y;
            dst->region[i].num_mb_x     = src1->region[i].num_mb_x;
            dst->region[i].num_mb_y     = src1->region[i].num_mb_y;
            dst->region[i].buf_offset   = src1->region[i].buf_offset;
            dst->region[i].buf          = src1->buf;
        }
        ret = MPP_OK;
    } else if (src2) {
        memcpy(dst, src2, sizeof(MppEncOSDData2));
        ret = MPP_OK;
    } else {
        ret = MPP_NOK;
    }
    return ret;
}